

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

int init_socket(int port)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  int x;
  undefined4 local_2c;
  sockaddr local_28;
  char *local_18;
  
  local_2c = 1;
  __fd = socket(2,1,0);
  if (__fd < 0) {
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    local_28.sa_family = (sa_family_t)pcVar2;
    local_28.sa_data._0_2_ = SUB82((ulong)pcVar2 >> 0x10,0);
    local_28.sa_data._2_4_ = SUB84((ulong)pcVar2 >> 0x20,0);
    fmt._M_str = "Init_socket: socket: {}";
    fmt._M_len = 0x17;
    CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt,(char **)&local_28);
  }
  else {
    iVar1 = setsockopt(__fd,1,2,&local_2c,4);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      local_28.sa_family = (sa_family_t)pcVar2;
      local_28.sa_data._0_2_ = SUB82((ulong)pcVar2 >> 0x10,0);
      local_28.sa_data._2_4_ = SUB84((ulong)pcVar2 >> 0x20,0);
      fmt_00._M_str = "Init_socket: SO_REUSEADDR: {}";
      fmt_00._M_len = 0x1d;
      CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt_00,(char **)&local_28);
    }
    else {
      local_28.sa_data[10] = '\0';
      local_28.sa_data[0xb] = '\0';
      local_28.sa_data[0xc] = '\0';
      local_28.sa_data[0xd] = '\0';
      local_28.sa_data[2] = '\0';
      local_28.sa_data[3] = '\0';
      local_28.sa_data[4] = '\0';
      local_28.sa_data[5] = '\0';
      local_28.sa_data[6] = '\0';
      local_28.sa_data[7] = '\0';
      local_28.sa_data[8] = '\0';
      local_28.sa_data[9] = '\0';
      local_28.sa_family = 2;
      local_28.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      iVar1 = bind(__fd,&local_28,0x10);
      if (iVar1 < 0) {
        init_socket();
      }
      else {
        iVar1 = listen(__fd,3);
        if (-1 < iVar1) {
          return __fd;
        }
      }
      piVar3 = __errno_location();
      local_18 = strerror(*piVar3);
      fmt_01._M_str = "Init_socket: listen: {}";
      fmt_01._M_len = 0x17;
      CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_01,&local_18);
    }
    close(__fd);
  }
  exit(0);
}

Assistant:

int init_socket(int port)
{
	static struct sockaddr_in sa_zero;
	struct sockaddr_in sa;
	int x = 1;
	int fd;
	int done = 0;

BIND_AGAIN:

	if ((fd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
	{
		RS.Logger.Error("Init_socket: socket: {}", std::strerror(errno));
		exit(0);
	}

	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, (char *)&x, sizeof(x)) < 0)
	{
		RS.Logger.Error("Init_socket: SO_REUSEADDR: {}", std::strerror(errno));
		close(fd);
		exit(0);
	}
	/*
	#ifdef SO_DONTLINGER
		{
		struct	linger	ld;

		ld.l_onoff  = 1;
		ld.l_linger = 1000;

		if ( setsockopt( fd, SOL_SOCKET, SO_DONTLINGER,
		(char *) &ld, sizeof(ld) ) < 0 )
		{
			RS.Logger.Error("Init_socket: SO_DONTLINGER: {}", std::strerror(errno));
			close(fd);
			exit( SAFE_EXIT );
		}
		}
	#endif
	*/
	sa = sa_zero;
	sa.sin_family = AF_INET;
	sa.sin_port = htons(port);

	if (bind(fd, (struct sockaddr *)&sa, sizeof(sa)) < 0)
	{
		RS.Logger.Warn("Init_socket: bind: {}", std::strerror(errno));
		if (--done < 0)
		{
			fprintf(stderr, "Unable to allocate port.  Exiting.\n\r");
			close(fd);
			exit(0);
		}
		else
		{
			sleep(10);
			goto BIND_AGAIN;
		}
	}

	if (listen(fd, 3) < 0)
	{
		RS.Logger.Warn("Init_socket: listen: {}", std::strerror(errno));
		close(fd);
		exit(0);
	}

	return fd;
}